

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O2

RealType __thiscall OpenMD::Bond::getValue(Bond *this,int snap)

{
  SnapshotManager *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  double dVar3;
  Vector3d r12;
  Vector<double,_3U> VStack_88;
  Vector<double,_3U> local_70;
  Vector<double,_3U> local_58;
  Vector<double,_3U> local_40;
  
  StuntDouble::getPos((Vector3d *)&local_70,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1]->super_StuntDouble,snap);
  StuntDouble::getPos((Vector3d *)&VStack_88,
                      &(*(this->super_ShortRangeInteraction).atoms_.
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start)->super_StuntDouble,snap);
  operator-(&local_58,&local_70,&VStack_88);
  Vector<double,_3U>::Vector(&local_40,&local_58);
  pSVar1 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar2 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,snap);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var,iVar2),(Vector3d *)&local_40);
  dVar3 = Vector<double,_3U>::length(&local_40);
  return dVar3;
}

Assistant:

RealType getValue(int snap) {
      Vector3d r12 = atoms_[1]->getPos(snap) - atoms_[0]->getPos(snap);
      snapshotMan_->getSnapshot(snap)->wrapVector(r12);
      return r12.length();
    }